

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtering_inotify_poller.cc
# Opt level: O0

optional<InotifyEvent> * __thiscall
FilteringInotifyPoller::GetNextEvent
          (optional<InotifyEvent> *__return_storage_ptr__,FilteringInotifyPoller *this)

{
  bool bVar1;
  optional *this_00;
  InotifyEvent *pIVar2;
  bool local_79;
  optional<InotifyEvent> local_50;
  undefined1 local_19;
  FilteringInotifyPoller *local_18;
  FilteringInotifyPoller *this_local;
  optional<InotifyEvent> *event;
  
  local_19 = 0;
  local_18 = this;
  this_local = (FilteringInotifyPoller *)__return_storage_ptr__;
  std::experimental::fundamentals_v1::optional<InotifyEvent>::optional(__return_storage_ptr__);
  do {
    (*this->ip_->_vptr_InotifyPoller[3])(&local_50);
    this_00 = (optional *)
              std::experimental::fundamentals_v1::optional<InotifyEvent>::operator=
                        (__return_storage_ptr__,&local_50);
    bVar1 = std::experimental::fundamentals_v1::optional::operator_cast_to_bool(this_00);
    local_79 = false;
    if (bVar1) {
      pIVar2 = std::experimental::fundamentals_v1::optional<InotifyEvent>::operator->
                         (__return_storage_ptr__);
      local_79 = std::
                 regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                           (&pIVar2->path,&this->regex_,0);
    }
    std::experimental::fundamentals_v1::optional<InotifyEvent>::~optional(&local_50);
  } while (local_79 != false);
  return __return_storage_ptr__;
}

Assistant:

std::experimental::optional<InotifyEvent>
FilteringInotifyPoller::GetNextEvent() {
  // Skip all events that have matching pathnames.
  std::experimental::optional<InotifyEvent> event;
  while ((event = ip_->GetNextEvent()) &&
         std::regex_search(event->path, regex_))
    ;
  return event;
}